

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void gvn(gen_ctx_t gen_ctx)

{
  bb_t_conflict *__base;
  size_t __nmemb;
  bb_t_conflict local_18;
  bb_t_conflict bb;
  gen_ctx_t gen_ctx_local;
  
  calculate_memory_availability(gen_ctx);
  calculate_dominators(gen_ctx);
  VARR_bb_ttrunc(gen_ctx->data_flow_ctx->worklist,0);
  for (local_18 = DLIST_bb_t_head(&gen_ctx->curr_cfg->bbs); local_18 != (bb_t_conflict)0x0;
      local_18 = DLIST_bb_t_next(local_18)) {
    VARR_bb_tpush(gen_ctx->data_flow_ctx->worklist,local_18);
  }
  __base = VARR_bb_taddr(gen_ctx->data_flow_ctx->worklist);
  __nmemb = VARR_bb_tlength(gen_ctx->data_flow_ctx->worklist);
  qsort(__base,__nmemb,8,post_cmp);
  gvn_modify(gen_ctx);
  return;
}

Assistant:

static void gvn (gen_ctx_t gen_ctx) {
  calculate_memory_availability (gen_ctx);
  calculate_dominators (gen_ctx);
  VARR_TRUNC (bb_t, worklist, 0);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    VARR_PUSH (bb_t, worklist, bb);
  qsort (VARR_ADDR (bb_t, worklist), VARR_LENGTH (bb_t, worklist), sizeof (bb_t), post_cmp);
  gvn_modify (gen_ctx);
}